

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void fs_write_alotof_bufs_with_offset(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uv_buf_t *bufs;
  char *__ptr;
  uv_loop_t *puVar4;
  uv_buf_t *unaff_RBX;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  uv_buf_t uVar8;
  char acStack_42 [2];
  uv_buf_t *puStack_40;
  
  puStack_40 = (uv_buf_t *)0x15f54e;
  unlink("test_file");
  puStack_40 = (uv_buf_t *)0x15f553;
  loop = uv_default_loop();
  puStack_40 = (uv_buf_t *)0x15f564;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_0015f8a9:
    bufs = unaff_RBX;
    puStack_40 = (uv_buf_t *)0x15f8ae;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_0015f8ae:
    puStack_40 = (uv_buf_t *)0x15f8b3;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_0015f8b3:
    puStack_40 = (uv_buf_t *)0x15f8b8;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015f8b8:
    puStack_40 = (uv_buf_t *)0x15f8bd;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_0015f8bd:
    puStack_40 = (uv_buf_t *)0x15f8c2;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_0015f8c2:
    puStack_40 = (uv_buf_t *)0x15f8c7;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_0015f8c7:
    puStack_40 = (uv_buf_t *)0x15f8cc;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_0015f8cc:
    puStack_40 = (uv_buf_t *)0x15f8d1;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_0015f8d1:
    puStack_40 = (uv_buf_t *)0x15f8d6;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_0015f8d6:
    puStack_40 = (uv_buf_t *)0x15f8db;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_0015f8db:
    puStack_40 = (uv_buf_t *)0x15f8e0;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_0015f8e0:
    puStack_40 = (uv_buf_t *)0x15f8e5;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0015f8e5:
    puStack_40 = (uv_buf_t *)0x15f8ea;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_0015f8ea:
    puStack_40 = (uv_buf_t *)0x15f8ef;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_0015f8ef:
    puStack_40 = (uv_buf_t *)0x15f8f4;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_40 = (uv_buf_t *)0x15f593;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f8ae;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f8b3;
    puStack_40 = (uv_buf_t *)0x15f5b5;
    uv_fs_req_cleanup(&open_req1);
    puStack_40 = (uv_buf_t *)0x15f5c6;
    iov = uv_buf_init("0123456789",10);
    puStack_40 = (uv_buf_t *)0x15f604;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015f8b8;
    if (write_req.result != 10) goto LAB_0015f8bd;
    puStack_40 = (uv_buf_t *)0x15f627;
    uv_fs_req_cleanup(&write_req);
    lVar6 = 8;
    do {
      puStack_40 = (uv_buf_t *)0x15f641;
      uVar8 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar6 + -8) = uVar8.base;
      *(size_t *)((long)&bufs->base + lVar6) = uVar8.len;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0xd4318);
    puStack_40 = (uv_buf_t *)0x15f682;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,10,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f8c2;
    if (write_req.result != 0xac67d) goto LAB_0015f8c7;
    puStack_40 = (uv_buf_t *)0x15f6a7;
    uv_fs_req_cleanup(&write_req);
    puStack_40 = (uv_buf_t *)0x15f6b1;
    __ptr = (char *)malloc(0xac67d);
    if (__ptr == (char *)0x0) goto LAB_0015f8cc;
    lVar6 = 8;
    pcVar7 = __ptr;
    do {
      puStack_40 = (uv_buf_t *)0x15f6d3;
      uVar8 = uv_buf_init(pcVar7,0xd);
      *(char **)((long)bufs + lVar6 + -8) = uVar8.base;
      *(size_t *)((long)&bufs->base + lVar6) = uVar8.len;
      lVar6 = lVar6 + 0x10;
      pcVar7 = pcVar7 + 0xd;
    } while (lVar6 != 0xd4318);
    puStack_40 = (uv_buf_t *)0x15f718;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,10,
                       (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f8d1;
    lVar6 = 0xd;
    if (iVar2 != 0xd) {
      lVar6 = 0x3400;
    }
    if (read_req.result != lVar6) goto LAB_0015f8d6;
    pcVar7 = __ptr;
    uVar5 = 0;
    do {
      puStack_40 = (uv_buf_t *)0x15f75d;
      iVar3 = strncmp(pcVar7,test_buf,0xd);
      if (iVar3 != 0) {
        puStack_40 = (uv_buf_t *)0x15f8a9;
        fs_write_alotof_bufs_with_offset_cold_9();
        unaff_RBX = bufs;
        goto LAB_0015f8a9;
      }
      if (iVar2 == 0xd) break;
      pcVar7 = pcVar7 + 0xd;
      bVar1 = uVar5 < 0x3ff;
      uVar5 = uVar5 + 1;
    } while (bVar1);
    puStack_40 = (uv_buf_t *)0x15f78a;
    uv_fs_req_cleanup(&read_req);
    puStack_40 = (uv_buf_t *)0x15f792;
    free(__ptr);
    puStack_40 = (uv_buf_t *)0x15f7a9;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f8db;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_0015f8e0;
    puStack_40 = (uv_buf_t *)0x15f7d9;
    uv_fs_req_cleanup(&stat_req);
    puStack_40 = (uv_buf_t *)0x15f7ea;
    uVar8 = uv_buf_init(buf,0x20);
    puStack_40 = (uv_buf_t *)0x15f82c;
    iov = uVar8;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f8e5;
    if (read_req.result != 0) goto LAB_0015f8ea;
    puStack_40 = (uv_buf_t *)0x15f84e;
    uv_fs_req_cleanup(&read_req);
    puStack_40 = (uv_buf_t *)0x15f864;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f8ef;
    if (close_req.result == 0) {
      puStack_40 = (uv_buf_t *)0x15f882;
      uv_fs_req_cleanup(&close_req);
      puStack_40 = (uv_buf_t *)0x15f88e;
      unlink("test_file");
      free(bufs);
      return;
    }
  }
  puStack_40 = (uv_buf_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_40 = bufs;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_0015fa70;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015fa75;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = uv_buf_init(acStack_42,2);
    iov = uVar8;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_0015fa7a;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0015fa84;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015fa70:
    run_test_fs_read_dir_cold_2();
LAB_0015fa75:
    run_test_fs_read_dir_cold_3();
LAB_0015fa7a:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_0015fa84:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_write_alotof_bufs_with_offset(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;
  int64_t offset;
  char* filler;
  int filler_len;

  filler = "0123456789";
  filler_len = strlen(filler);
  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT_NOT_NULL(iovs);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(filler, filler_len);
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == filler_len);
  ASSERT(write_req.result == filler_len);
  uv_fs_req_cleanup(&write_req);
  offset = (int64_t)r;

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  offset,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT_NOT_NULL(buffer);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_read(NULL, &read_req, open_req1.result,
                 iovs, iovcount, offset, NULL);
  ASSERT(r >= 0);
  if (r == sizeof(test_buf))
    iovcount = 1; /* Infer that preadv is not available. */
  else if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  r = uv_fs_stat(NULL, &stat_req, "test_file", NULL);
  ASSERT(r == 0);
  ASSERT((int64_t)((uv_stat_t*)stat_req.ptr)->st_size ==
         offset + (int64_t)write_req.result);
  uv_fs_req_cleanup(&stat_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 offset + write_req.result,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}